

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

RangeDimensionSpecifierSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::RangeDimensionSpecifierSyntax,slang::syntax::SelectorSyntax&>
          (BumpAllocator *this,SelectorSyntax *args)

{
  RangeDimensionSpecifierSyntax *this_00;
  
  this_00 = (RangeDimensionSpecifierSyntax *)allocate(this,0x18,8);
  slang::syntax::RangeDimensionSpecifierSyntax::RangeDimensionSpecifierSyntax(this_00,args);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }